

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O1

int do_cmp(void)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  vm_register *pvVar5;
  undefined4 *puVar6;
  char cVar7;
  short sVar8;
  int iVar9;
  bool bVar10;
  
  pvVar5 = registe_ptr;
  uVar2 = registe_ptr->IP;
  bVar1 = code_ptr[uVar2 + 2];
  bVar3 = bVar1 >> 4;
  if (code_ptr[uVar2 + 1] == '\x01') {
    iVar9 = *register_list[bVar3] - (int)code_ptr[uVar2 + 3];
  }
  else {
    if (code_ptr[uVar2 + 1] != '\0') {
LAB_00103bce:
      puVar6 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar6 = 0xf6;
      __cxa_throw(puVar6,&int::typeinfo,0);
    }
    bVar4 = (byte)code_ptr[uVar2 + 3] >> 4;
    if ((bVar1 & 0xf) != 2) {
      if ((bVar1 & 0xf) == 1) {
        sVar8 = (short)*register_list[bVar3] - (short)*register_list[bVar4];
        if ((short)*register_list[bVar3] != (short)*register_list[bVar4]) {
          bVar10 = sVar8 < 0;
          if (0 < sVar8) {
LAB_00103b8b:
            pvVar5->flag[0] = '\x01';
            pvVar5->flag[1] = '\x01';
            return 1;
          }
LAB_00103b3d:
          if (!bVar10) {
            return 1;
          }
          pvVar5->flag[0] = '\x01';
          pvVar5->flag[1] = '\0';
          return 1;
        }
      }
      else {
        if ((bVar1 & 0xf) != 0) goto LAB_00103bce;
        cVar7 = (char)*register_list[bVar3] - (char)*register_list[bVar4];
        if ((char)*register_list[bVar3] != (char)*register_list[bVar4]) {
          bVar10 = cVar7 < '\0';
          if ('\0' < cVar7) goto LAB_00103b8b;
          goto LAB_00103b3d;
        }
      }
      goto LAB_00103baf;
    }
    iVar9 = *register_list[bVar3] - *register_list[bVar4];
  }
  if (iVar9 != 0) {
    registe_ptr->flag[0] = '\x01';
    if (0 < iVar9) {
      pvVar5->flag[1] = '\x01';
      return 1;
    }
    pvVar5->flag[1] = '\0';
    return 1;
  }
LAB_00103baf:
  registe_ptr->flag[0] = '\0';
  return 1;
}

Assistant:

int do_cmp() {
	uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
	uint8_t low = (uint8_t)code_ptr[registe_ptr->IP + 2] % 0x10;
	if (code_ptr[registe_ptr->IP + 1] == '\x00') {//寄存器比较
			uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
			if (low == 0) {
				char*Ra = (char *)register_list[high];
				char*Rb = (char*)register_list[highb];
				char temp = *Ra - *Rb;
				set_flag(temp);
			}
			else if (low == 1)
			{
				int16_t*Ra = (int16_t *)register_list[high];
				int16_t*Rb = (int16_t *)register_list[highb];
				int16_t temp = *Ra - *Rb;
				set_flag(temp);
			}
			else if (low == 2)
			{
				unsigned*Ra = (unsigned *)register_list[high];
				unsigned*Rb = (unsigned*)register_list[highb];
				unsigned temp = *Ra - *Rb;
				set_flag(temp);
			}
			else throw(LVM_EXECUTE_ERROR);
	}
	else if (code_ptr[registe_ptr->IP + 1] == '\x01') {//立即数比较
		unsigned i = code_ptr[registe_ptr->IP + 3];
		set_flag(*register_list[high] - i);
	}
	else throw(LVM_EXECUTE_ERROR);
	return LVM_SUCCESS;
}